

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf.h
# Opt level: O3

uint * gf_polydiv_recursive(uint *a,uint alen,uint *b,uint blen,uint *new_len)

{
  uint uVar1;
  int iVar2;
  size_t __nmemb;
  void *__ptr;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  size_t sVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  uint *__src;
  ulong __nmemb_00;
  
  __nmemb_00 = (ulong)alen;
  if (alen < blen) {
    return a;
  }
LAB_0010179f:
  iVar9 = blen - (int)__nmemb_00;
  __src = a;
  __nmemb = __nmemb_00;
  do {
    iVar2 = (int)__nmemb;
    uVar3 = iVar2 - 1;
    __nmemb_00 = (ulong)uVar3;
    if ((ulong)__src[__nmemb_00] == 0) {
      uVar10 = 0;
    }
    else if ((ulong)b[blen - 1] == 0) {
      uVar10 = 0xffffffff;
    }
    else {
      iVar4 = index_of[__src[__nmemb_00]] - index_of[b[blen - 1]];
      iVar7 = iVar4 + 0xff;
      if (-1 < iVar4) {
        iVar7 = iVar4;
      }
      uVar10 = alpha_of[iVar7];
    }
    __ptr = calloc(__nmemb,4);
    if (__nmemb == 0) {
LAB_001018ab:
      a = (uint *)calloc(__nmemb_00,4);
LAB_001018bd:
      memcpy(a,__src,(ulong)(iVar2 - 2) * 4 + 4);
    }
    else {
      uVar5 = 0;
      do {
        uVar8 = 0;
        if (iVar2 - blen <= uVar5) {
          uVar8 = b[(uint)(iVar9 + (int)uVar5)];
        }
        *(uint *)((long)__ptr + uVar5 * 4) = uVar8;
        uVar5 = uVar5 + 1;
      } while (__nmemb != uVar5);
      if (iVar2 == 0) goto LAB_001018ab;
      sVar6 = 0;
      do {
        uVar8 = 0;
        if ((uVar10 != 0) && (uVar1 = *(uint *)((long)__ptr + sVar6 * 4), uVar1 != 0)) {
          uVar8 = index_of[uVar10] + index_of[uVar1];
          uVar1 = (index_of[uVar10] - 0xff) + index_of[uVar1];
          if (uVar8 < 0xff) {
            uVar1 = uVar8;
          }
          uVar8 = alpha_of[uVar1];
        }
        *(uint *)((long)__ptr + sVar6 * 4) = uVar8;
        __src[sVar6] = __src[sVar6] ^ uVar8;
        sVar6 = sVar6 + 1;
      } while (__nmemb != sVar6);
      a = (uint *)calloc(__nmemb_00,4);
      if (uVar3 != 0) goto LAB_001018bd;
    }
    free(__src);
    free(__ptr);
    if (new_len == (uint *)0x0) break;
    *new_len = uVar3;
    iVar9 = iVar9 + 1;
    __src = a;
    __nmemb = __nmemb_00;
    if (uVar3 < blen) {
      return a;
    }
  } while( true );
  new_len = (uint *)0x0;
  if (uVar3 < blen) {
    return a;
  }
  goto LAB_0010179f;
}

Assistant:

uint32_t *gf_polydiv_recursive(uint32_t *a, uint32_t alen, uint32_t *b, uint32_t blen, uint32_t *new_len)
{
    if (alen < blen)
        return a;

    uint32_t q = gf_div(a[alen - 1], b[blen - 1]);

    // g = [0,0...0, b[0], b[1], b[n]]
    // alen-blen zeros at the start
    uint32_t *g = vector_new(alen);
    for (uint32_t i = 0; i < alen; i++)
        g[i] = (i < alen - blen) ? 0 : b[i - (alen - blen)];

    for (uint32_t i = 0; i < alen; i++)
    {
        g[i] = gf_mul(g[i], q);
        a[i] = gf_sum(a[i], g[i]);
    }

    uint32_t a_new_len = alen - 1;
    uint32_t *a_new = submatrix(a, 0, a_new_len);

    vector_free(a);
    vector_free(g);

    if (new_len != NULL)
        *new_len = a_new_len;

    return gf_polydiv_recursive(a_new, a_new_len, b, blen, new_len);
}